

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_protocol_handle_disconnect(ENetHost *host,ENetPeer *peer,ENetProtocol *command)

{
  uint32_t uVar1;
  ENetProtocol *command_local;
  ENetPeer *peer_local;
  ENetHost *host_local;
  
  if (((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE)) &&
     (peer->state != ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT)) {
    enet_peer_reset_queues(peer);
    if (((peer->state == ENET_PEER_STATE_CONNECTION_SUCCEEDED) ||
        (peer->state == ENET_PEER_STATE_DISCONNECTING)) ||
       (peer->state == ENET_PEER_STATE_CONNECTING)) {
      enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
    }
    else if ((peer->state == ENET_PEER_STATE_CONNECTED) ||
            (peer->state == ENET_PEER_STATE_DISCONNECT_LATER)) {
      if (((command->header).command & 0x80) == 0) {
        enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
      }
      else {
        enet_protocol_change_state(host,peer,ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT);
      }
    }
    else {
      if (peer->state == ENET_PEER_STATE_CONNECTION_PENDING) {
        host->recalculateBandwidthLimits = 1;
      }
      enet_peer_reset(peer);
    }
    if (peer->state != ENET_PEER_STATE_DISCONNECTED) {
      uVar1 = ntohl((command->disconnect).data);
      peer->eventData = uVar1;
    }
  }
  return 0;
}

Assistant:

static int
enet_protocol_handle_disconnect (ENetHost * host, ENetPeer * peer, const ENetProtocol * command)
{
    if (peer -> state == ENET_PEER_STATE_DISCONNECTED || peer -> state == ENET_PEER_STATE_ZOMBIE || peer -> state == ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT)
      return 0;

    enet_peer_reset_queues (peer);

    if (peer -> state == ENET_PEER_STATE_CONNECTION_SUCCEEDED || peer -> state == ENET_PEER_STATE_DISCONNECTING || peer -> state == ENET_PEER_STATE_CONNECTING)
        enet_protocol_dispatch_state (host, peer, ENET_PEER_STATE_ZOMBIE);
    else
    if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
    {
        if (peer -> state == ENET_PEER_STATE_CONNECTION_PENDING) host -> recalculateBandwidthLimits = 1;

        enet_peer_reset (peer);
    }
    else
    if (command -> header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
      enet_protocol_change_state (host, peer, ENET_PEER_STATE_ACKNOWLEDGING_DISCONNECT);
    else
      enet_protocol_dispatch_state (host, peer, ENET_PEER_STATE_ZOMBIE);

    if (peer -> state != ENET_PEER_STATE_DISCONNECTED)
      peer -> eventData = ENET_NET_TO_HOST_32 (command -> disconnect.data);

    return 0;
}